

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

string * __thiscall
fakeit::DefaultEventFormatter::format_abi_cxx11_
          (string *__return_storage_ptr__,DefaultEventFormatter *this,SequenceVerificationEvent *e)

{
  ostream *poVar1;
  long *plVar2;
  vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> *expectedPattern_00;
  vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> actualSequence;
  vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> expectedPattern;
  ostringstream out;
  string local_1c8;
  vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> local_1a8;
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Verification error",0x12)
  ;
  std::ios::widen((char)(ostringstream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
  std::ostream::put((char)local_190);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected pattern: ",0x12)
  ;
  std::vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_>::vector
            (&local_1a8,
             (vector<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_> *)(e + 0x28));
  formatExpectedPattern_abi_cxx11_
            (&local_1c8,(DefaultEventFormatter *)&local_1a8,expectedPattern_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected matches: ",0x12)
  ;
  formatExpectedCount((ostream *)local_190,*(VerificationType *)(e + 8),*(int *)(e + 0x58));
  std::ios::widen((char)(ostream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
  std::ostream::put((char)local_190);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Actual matches  : ",0x12)
  ;
  plVar2 = (long *)std::ostream::operator<<((ostream *)local_190,*(int *)(e + 0x5c));
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_>::vector
            ((vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> *)&local_1c8,
             (vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> *)(e + 0x40));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Actual sequence : total of ",0x1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," actual invocations",0x13);
  if ((pointer)local_1c8._M_string_length == local_1c8._M_dataplus._M_p) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".",1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    std::ios::widen((char)(ostream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
    std::ostream::put((char)local_190);
    std::ostream::flush();
  }
  formatInvocationList
            ((ostream *)local_190,
             (vector<fakeit::Invocation_*,_std::allocator<fakeit::Invocation_*>_> *)&local_1c8);
  std::__cxx11::stringbuf::str();
  if (local_1c8._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    local_1c8.field_2._M_allocated_capacity - (long)local_1c8._M_dataplus._M_p);
  }
  if (local_1a8.super__Vector_base<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<fakeit::Sequence_*,_std::allocator<fakeit::Sequence_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string format(const SequenceVerificationEvent &e) override {
            std::ostringstream out;
            out << "Verification error" << std::endl;

            out << "Expected pattern: ";
            const std::vector<fakeit::Sequence *> expectedPattern = e.expectedPattern();
            out << formatExpectedPattern(expectedPattern) << std::endl;

            out << "Expected matches: ";
            formatExpectedCount(out, e.verificationType(), e.expectedCount());
            out << std::endl;

            out << "Actual matches  : " << e.actualCount() << std::endl;

            auto actualSequence = e.actualSequence();
            out << "Actual sequence : total of " << actualSequence.size() << " actual invocations";
            if (actualSequence.size() == 0) {
                out << ".";
            } else {
                out << ":" << std::endl;
            }
            formatInvocationList(out, actualSequence);

            return out.str();
        }